

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

void pbrt::RealisticCamera::ComputeCardinalPoints(Ray *rIn,Ray *rOut,Float *pz,Float *fz)

{
  *fz = -((rOut->o).super_Tuple3<pbrt::Point3,_float>.z -
         ((rOut->o).super_Tuple3<pbrt::Point3,_float>.x /
         (rOut->d).super_Tuple3<pbrt::Vector3,_float>.x) *
         (rOut->d).super_Tuple3<pbrt::Vector3,_float>.z);
  *pz = -((((rIn->o).super_Tuple3<pbrt::Point3,_float>.x -
           (rOut->o).super_Tuple3<pbrt::Point3,_float>.x) /
          (rOut->d).super_Tuple3<pbrt::Vector3,_float>.x) *
          (rOut->d).super_Tuple3<pbrt::Vector3,_float>.z +
         (rOut->o).super_Tuple3<pbrt::Point3,_float>.z);
  return;
}

Assistant:

void RealisticCamera::ComputeCardinalPoints(const Ray &rIn, const Ray &rOut, Float *pz,
                                            Float *fz) {
    Float tf = -rOut.o.x / rOut.d.x;
    *fz = -rOut(tf).z;
    Float tp = (rIn.o.x - rOut.o.x) / rOut.d.x;
    *pz = -rOut(tp).z;
}